

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recursive_descent_parser.cpp
# Opt level: O2

JsonValue * __thiscall MercuryJson::JSON::_parse_object(JSON *this)

{
  ulong *puVar1;
  ulong uVar2;
  JsonObject *args;
  JsonObject *pJVar3;
  JsonObject *pJVar4;
  JsonValue *pJVar5;
  ulong index;
  runtime_error *this_00;
  ulong index_00;
  char cVar6;
  char *pcVar7;
  
  puVar1 = this->idx_ptr;
  pcVar7 = this->input;
  index_00 = *puVar1;
  cVar6 = pcVar7[index_00];
  if (cVar6 == '\"') {
    this->idx_ptr = puVar1 + 1;
    if (index_00 < this->input_len) {
      this->idx_ptr = puVar1 + 2;
      index = puVar1[1];
      if (index < this->input_len) {
        cVar6 = pcVar7[index];
        if (cVar6 != ':') {
LAB_001123dd:
          _error(this,"\':\'",cVar6,index);
        }
        pJVar5 = _parse_value(this);
        args = BlockAllocator<MercuryJson::JsonValue>::
               construct<MercuryJson::JsonObject,char*,MercuryJson::JsonValue*>
                         (&this->allocator,pcVar7 + index_00 + 1,pJVar5);
        pJVar3 = args;
        while( true ) {
          puVar1 = this->idx_ptr;
          uVar2 = this->input_len;
          this->idx_ptr = puVar1 + 1;
          index_00 = *puVar1;
          if (uVar2 <= index_00) break;
          pcVar7 = this->input;
          cVar6 = pcVar7[index_00];
          if (cVar6 != ',') {
            if (cVar6 == '}') goto LAB_001123cf;
            pcVar7 = "\',\'";
            goto LAB_00112472;
          }
          index_00 = puVar1[1];
          cVar6 = pcVar7[index_00];
          if (cVar6 != '\"') goto LAB_0011242e;
          this->idx_ptr = puVar1 + 2;
          if (uVar2 <= index_00) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,"text ended prematurely");
            goto LAB_00112451;
          }
          this->idx_ptr = puVar1 + 3;
          index = puVar1[2];
          if (uVar2 <= index) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,"text ended prematurely");
            goto LAB_00112451;
          }
          cVar6 = pcVar7[index];
          if (cVar6 != ':') goto LAB_001123dd;
          pJVar5 = _parse_value(this);
          pJVar4 = BlockAllocator<MercuryJson::JsonValue>::
                   construct<MercuryJson::JsonObject,char*,MercuryJson::JsonValue*>
                             (&this->allocator,pcVar7 + index_00 + 1,pJVar5);
          pJVar3->next = pJVar4;
          pJVar3 = pJVar4;
        }
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"text ended prematurely");
      }
      else {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"text ended prematurely");
      }
    }
    else {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"text ended prematurely");
    }
  }
  else {
    if (cVar6 != '}') {
LAB_0011242e:
      pcVar7 = "\'\"\'";
LAB_00112472:
      _error(this,pcVar7,cVar6,index_00);
    }
    this->idx_ptr = puVar1 + 1;
    if (index_00 < this->input_len) {
      args = (JsonObject *)0x0;
LAB_001123cf:
      pJVar5 = BlockAllocator<MercuryJson::JsonValue>::
               construct<MercuryJson::JsonValue,MercuryJson::JsonObject*>(&this->allocator,args);
      return pJVar5;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"text ended prematurely");
  }
LAB_00112451:
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

JsonValue *JSON::_parse_object() {
        size_t idx;
        char ch;
        peek_char();
        if (ch == '}') {
            next_char();
            return allocator.construct(static_cast<JsonObject *>(nullptr));
        }

        expect('"');
        char *str = _parse_str(idx);
        next_char();
        next_char();
        expect(':');
        JsonValue *value = _parse_value();
        auto *object = allocator.construct<JsonObject>(str, value), *ptr = object;
        while (true) {
            next_char();
            if (ch == '}') break;
            expect(',');
            peek_char();
            expect('"');
            str = _parse_str(idx);
            next_char();
            next_char();
            expect(':');
            value = _parse_value();
            ptr = ptr->next = allocator.construct<JsonObject>(str, value);
        }
        return allocator.construct(object);
    }